

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

bool __thiscall MinVR::VRPoint3::operator!=(VRPoint3 *this,VRPoint3 *p)

{
  bool bVar1;
  
  bVar1 = true;
  if ((ABS(p->x - this->x) < 1e-08) && (ABS(p->y - this->y) < 1e-08)) {
    bVar1 = 1e-08 <= ABS(p->z - this->z);
  }
  return bVar1;
}

Assistant:

bool VRPoint3::operator!=(const VRPoint3& p) const {
  return (fabs(p.x - x) >= VRMATH_EPSILON || 
    fabs(p.y - y) >= VRMATH_EPSILON || 
    fabs(p.z - z) >= VRMATH_EPSILON);
}